

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InternalException::
InternalException<duckdb::hugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
          (InternalException *this,string *msg,hugeint_t params,uhugeint_t params_1,
          uhugeint_t params_2)

{
  hugeint_t params_00;
  uhugeint_t in_stack_ffffffffffffffc8;
  
  params_00.upper = params_1.lower;
  params_00.lower = params.upper;
  Exception::ConstructMessage<duckdb::hugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
            ((string *)&stack0xffffffffffffffd0,(Exception *)msg,(string *)params.lower,params_00,
             params_2,in_stack_ffffffffffffffc8);
  InternalException(this,(string *)&stack0xffffffffffffffd0);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}